

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O0

vector<ROM::Description,_std::allocator<ROM::Description>_> * ROM::all_descriptions(void)

{
  vector<ROM::Description,_std::allocator<ROM::Description>_> *in_RDI;
  Description local_b0;
  Name local_18;
  undefined1 local_11;
  int name;
  vector<ROM::Description,_std::allocator<ROM::Description>_> *result;
  
  local_11 = 0;
  std::vector<ROM::Description,_std::allocator<ROM::Description>_>::vector(in_RDI);
  for (local_18 = AcornBASICII; (int)local_18 < 0x68; local_18 = local_18 + AcornBASICII) {
    Description::Description(&local_b0,local_18);
    std::vector<ROM::Description,_std::allocator<ROM::Description>_>::push_back(in_RDI,&local_b0);
    Description::~Description(&local_b0);
  }
  return in_RDI;
}

Assistant:

std::vector<Description> ROM::all_descriptions() {
	std::vector<Description> result;
	for(int name = 1; name <= MaxName; name++) {
		result.push_back(Description(ROM::Name(name)));
	}
	return result;
}